

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

time_t __thiscall Pathie::Path::atime(Path *this)

{
  int iVar1;
  char *__file;
  ErrnoError *this_00;
  int *piVar2;
  undefined1 local_c0 [8];
  string nstr;
  undefined1 local_a0 [8];
  stat s;
  Path *this_local;
  
  s.__glibc_reserved[2] = (__syscall_slong_t)this;
  native_abi_cxx11_((Path *)local_c0);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = ::stat(__file,(stat *)local_a0);
  if (iVar1 < 0) {
    this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
    piVar2 = __errno_location();
    ErrnoError::ErrnoError(this_00,*piVar2);
    __cxa_throw(this_00,&ErrnoError::typeinfo,ErrnoError::~ErrnoError);
  }
  std::__cxx11::string::~string((string *)local_c0);
  return s.st_blocks;
}

Assistant:

time_t Path::atime() const
{
#if defined(_PATHIE_UNIX)
  struct stat s;
  std::string nstr = native();

  if (::stat(nstr.c_str(), &s) < 0)
    throw(Pathie::ErrnoError(errno));
#elif defined(_WIN32)
  struct _stat s;
  std::wstring utf16 = utf8_to_utf16(m_path);

  if (_wstat(utf16.c_str(), &s) < 0)
    throw(Pathie::ErrnoError(errno));
#else
#error Unsupported system.
#endif

  return s.st_atime;
}